

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

bool __thiscall
jrtplib::RTPUDPv6Transmitter::ShouldAcceptData
          (RTPUDPv6Transmitter *this,in6_addr srcip,uint16_t srcport)

{
  PortInfo *pPVar1;
  bool bVar2;
  PortInfo **ppPVar3;
  reference puVar4;
  iterator local_138;
  _List_const_iterator<unsigned_short> local_130;
  iterator local_128;
  _List_const_iterator<unsigned_short> local_120;
  _List_const_iterator<unsigned_short> local_118;
  const_iterator end_3;
  const_iterator begin_3;
  const_iterator it_3;
  iterator local_f8;
  _List_const_iterator<unsigned_short> local_f0;
  iterator local_e8;
  _List_const_iterator<unsigned_short> local_e0;
  _List_const_iterator<unsigned_short> local_d8;
  const_iterator end_2;
  const_iterator begin_2;
  const_iterator it_2;
  PortInfo *inf_1;
  iterator local_b0;
  _List_const_iterator<unsigned_short> local_a8;
  iterator local_a0;
  _List_const_iterator<unsigned_short> local_98;
  _List_const_iterator<unsigned_short> local_90;
  const_iterator end_1;
  const_iterator begin_1;
  const_iterator it_1;
  iterator local_70;
  _List_const_iterator<unsigned_short> local_68;
  iterator local_60;
  _List_const_iterator<unsigned_short> local_58;
  _List_const_iterator<unsigned_short> local_50;
  const_iterator end;
  const_iterator begin;
  const_iterator it;
  PortInfo *inf;
  uint16_t srcport_local;
  RTPUDPv6Transmitter *this_local;
  in6_addr srcip_local;
  
  srcip_local.__in6_u._0_8_ = srcip.__in6_u._8_8_;
  register0x00000030 = srcip.__in6_u._0_8_;
  if (this->receivemode == AcceptSome) {
    RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
    ::GotoElement(&this->acceptignoreinfo,(in6_addr *)((long)&this_local + 4));
    bVar2 = RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
            ::HasCurrentElement(&this->acceptignoreinfo);
    if (bVar2) {
      ppPVar3 = RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
                ::GetCurrentElement(&this->acceptignoreinfo);
      pPVar1 = *ppPVar3;
      if ((pPVar1->all & 1U) == 0) {
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&begin);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&end);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_50);
        local_60._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_58,&local_60);
        end._M_node = local_58._M_node;
        local_70._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_68,&local_70);
        local_50._M_node = local_68._M_node;
        begin = end;
        while (bVar2 = std::operator!=(&begin,&local_50), bVar2) {
          puVar4 = std::_List_const_iterator<unsigned_short>::operator*(&begin);
          if (*puVar4 == srcport) {
            return true;
          }
          std::_List_const_iterator<unsigned_short>::operator++(&begin,0);
        }
        srcip_local.__in6_u.__u6_addr8[0xb] = '\0';
      }
      else {
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&begin_1);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&end_1);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_90);
        local_a0._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_98,&local_a0);
        end_1._M_node = local_98._M_node;
        local_b0._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_a8,&local_b0);
        local_90._M_node = local_a8._M_node;
        begin_1 = end_1;
        while (bVar2 = std::operator!=(&begin_1,&local_90), bVar2) {
          puVar4 = std::_List_const_iterator<unsigned_short>::operator*(&begin_1);
          if (*puVar4 == srcport) {
            return false;
          }
          std::_List_const_iterator<unsigned_short>::operator++(&begin_1,0);
        }
        srcip_local.__in6_u.__u6_addr8[0xb] = '\x01';
      }
    }
    else {
      srcip_local.__in6_u.__u6_addr8[0xb] = '\0';
    }
  }
  else {
    RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
    ::GotoElement(&this->acceptignoreinfo,(in6_addr *)((long)&this_local + 4));
    bVar2 = RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
            ::HasCurrentElement(&this->acceptignoreinfo);
    if (bVar2) {
      ppPVar3 = RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
                ::GetCurrentElement(&this->acceptignoreinfo);
      pPVar1 = *ppPVar3;
      if ((pPVar1->all & 1U) == 0) {
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&begin_2);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&end_2);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_d8);
        local_e8._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_e0,&local_e8);
        end_2._M_node = local_e0._M_node;
        local_f8._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_f0,&local_f8);
        local_d8._M_node = local_f0._M_node;
        begin_2 = end_2;
        while (bVar2 = std::operator!=(&begin_2,&local_d8), bVar2) {
          puVar4 = std::_List_const_iterator<unsigned_short>::operator*(&begin_2);
          if (*puVar4 == srcport) {
            return false;
          }
          std::_List_const_iterator<unsigned_short>::operator++(&begin_2,0);
        }
        srcip_local.__in6_u.__u6_addr8[0xb] = '\x01';
      }
      else {
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&begin_3);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&end_3);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_118);
        local_128._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_120,&local_128);
        end_3._M_node = local_120._M_node;
        local_138._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::end
                       (&pPVar1->portlist);
        std::_List_const_iterator<unsigned_short>::_List_const_iterator(&local_130,&local_138);
        local_118._M_node = local_130._M_node;
        begin_3 = end_3;
        while (bVar2 = std::operator!=(&begin_3,&local_118), bVar2) {
          puVar4 = std::_List_const_iterator<unsigned_short>::operator*(&begin_3);
          if (*puVar4 == srcport) {
            return true;
          }
          std::_List_const_iterator<unsigned_short>::operator++(&begin_3,0);
        }
        srcip_local.__in6_u.__u6_addr8[0xb] = '\0';
      }
    }
    else {
      srcip_local.__in6_u.__u6_addr8[0xb] = '\x01';
    }
  }
  return (bool)srcip_local.__in6_u.__u6_addr8[0xb];
}

Assistant:

bool RTPUDPv6Transmitter::ShouldAcceptData(in6_addr srcip,uint16_t srcport)
{
	if (receivemode == RTPTransmitter::AcceptSome)
	{
		PortInfo *inf;

		acceptignoreinfo.GotoElement(srcip);
		if (!acceptignoreinfo.HasCurrentElement())
			return false;
		
		inf = acceptignoreinfo.GetCurrentElement();
		if (!inf->all) // only accept the ones in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return true;
			}
			return false;
		}
		else // accept all, except the ones in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return false;
			}
			return true;
		}
	}
	else // IgnoreSome
	{
		PortInfo *inf;

		acceptignoreinfo.GotoElement(srcip);
		if (!acceptignoreinfo.HasCurrentElement())
			return true;
		
		inf = acceptignoreinfo.GetCurrentElement();
		if (!inf->all) // ignore the ports in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return false;
			}
			return true;
		}
		else // ignore all, except the ones in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return true;
			}
			return false;
		}
	}
	return true;
}